

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

void flatbuffers::AppendTextWrappedString
               (stringstream *ss,string *text,size_t max_col,size_t start_col)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t max_col_00;
  ostream *poVar2;
  undefined8 uVar3;
  size_t start_col_00;
  ulong uVar4;
  ulong uVar5;
  string rest_of_description;
  string local_68;
  ulong local_48;
  ostream *local_40;
  size_t local_38;
  
  uVar5 = 0x50 - max_col;
  if (text->_M_string_length <= uVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),(text->_M_dataplus)._M_p,text->_M_string_length);
    return;
  }
  local_38 = max_col;
  local_48 = std::__cxx11::string::rfind((char)text,0x20);
  uVar4 = uVar5;
  if (local_48 < uVar5) {
    uVar4 = local_48;
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)text);
  local_40 = (ostream *)(ss + 0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(ss + 0x10),local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  max_col_00 = local_38;
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)max_col_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((uVar5 <= local_48) && (text->_M_string_length <= uVar4)) {
    uVar3 = std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar3);
  }
  start_col_00 = 0xffffffffffffffff;
  std::__cxx11::string::substr((ulong)&local_68,(ulong)text);
  AppendTextWrappedString(ss,&local_68,max_col_00,start_col_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void AppendTextWrappedString(std::stringstream &ss, std::string &text,
                                    size_t max_col, size_t start_col) {
  size_t max_line_length = max_col - start_col;

  if (text.length() > max_line_length) {
    size_t ideal_break_location = text.rfind(' ', max_line_length);
    size_t length = std::min(max_line_length, ideal_break_location);
    ss << text.substr(0, length) << "\n";
    ss << std::string(start_col, ' ');
    std::string rest_of_description = text.substr(
        ((ideal_break_location < max_line_length || text.at(length) == ' ')
             ? length + 1
             : length));
    AppendTextWrappedString(ss, rest_of_description, max_col, start_col);
  } else {
    ss << text;
  }
}